

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O3

void * NES_APU_np_Create(UINT32 clock,UINT32 rate)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  NES_APU *apu;
  long lVar4;
  ulong uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  
  pvVar3 = calloc(1,0x178);
  if (pvVar3 != (void *)0x0) {
    *(UINT32 *)((long)pvVar3 + 0x60) = clock;
    uVar5 = 0xac44;
    if (rate != 0) {
      uVar5 = (ulong)rate;
    }
    *(int *)((long)pvVar3 + 0x5c) = (int)uVar5;
    lVar4 = 0;
    *(ulong *)((long)pvVar3 + 0x168) = (uVar5 >> 1 | (ulong)clock << 0x20) / uVar5;
    *(undefined8 *)((long)pvVar3 + 8) = 0x100000001;
    *(undefined4 *)((long)pvVar3 + 0x10) = 1;
    auVar2 = _DAT_00172610;
    auVar1 = _DAT_00172600;
    do {
      iVar6 = (int)lVar4;
      auVar7._8_4_ = iVar6;
      auVar7._0_8_ = lVar4;
      auVar7._12_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar7 = (auVar7 | auVar1) ^ auVar2;
      if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7fffffe1) {
        *(int *)((long)pvVar3 + lVar4 * 4 + 0x68) =
             (int)(785448.96 / (8128.0 / (double)(iVar6 + 1) + 100.0));
        *(int *)((long)pvVar3 + lVar4 * 4 + 0x6c) =
             (int)(785448.96 / (8128.0 / (double)(iVar6 + 2) + 100.0));
      }
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x20);
    *(undefined4 *)((long)pvVar3 + 0xe4) = *(undefined4 *)((long)pvVar3 + 0xa0);
    *(undefined4 *)((long)pvVar3 + 0x2c) = 0x80;
    *(undefined8 *)((long)pvVar3 + 0x1c) = 0x8000000000;
    *(undefined8 *)((long)pvVar3 + 0x24) = 0x8000000080;
  }
  return pvVar3;
}

Assistant:

void* NES_APU_np_Create(UINT32 clock, UINT32 rate)
{
	NES_APU* apu;
	int i, c, t;

	apu = (NES_APU*)calloc(1, sizeof(NES_APU));
	if (apu == NULL)
		return NULL;

	NES_APU_np_SetClock(apu, clock);
	NES_APU_np_SetRate(apu, rate);
	apu->option[OPT_UNMUTE_ON_RESET] = true;
	apu->option[OPT_PHASE_REFRESH] = true;
	apu->option[OPT_NONLINEAR_MIXER] = true;
	apu->option[OPT_DUTY_SWAP] = false;
	apu->option[OPT_NEGATE_SWEEP_INIT] = false;

	apu->square_table[0] = 0;
	for(i=1;i<32;i++)
		apu->square_table[i]=(INT32)((8192.0*95.88)/(8128.0/i+100));

	apu->square_linear = apu->square_table[15]; // match linear scale to one full volume square of nonlinear

	for(c=0;c<2;++c)
		for(t=0;t<2;++t)
			apu->sm[c][t] = 128;

	apu->mask = 0;

	return apu;
}